

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool.cc
# Opt level: O3

void CRYPTO_BUFFER_POOL_free(CRYPTO_BUFFER_POOL *pool)

{
  CRYPTO_MUTEX *lock;
  size_t sVar1;
  
  if (pool == (CRYPTO_BUFFER_POOL *)0x0) {
    return;
  }
  lock = &pool->lock;
  CRYPTO_MUTEX_lock_write(lock);
  sVar1 = OPENSSL_lh_num_items((_LHASH *)pool->bufs);
  if (sVar1 == 0) {
    CRYPTO_MUTEX_unlock_write(lock);
    OPENSSL_lh_free((_LHASH *)pool->bufs);
    CRYPTO_MUTEX_cleanup(lock);
    OPENSSL_free(pool);
    return;
  }
  __assert_fail("lh_CRYPTO_BUFFER_num_items(pool->bufs) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pool/pool.cc"
                ,0x46,"void CRYPTO_BUFFER_POOL_free(CRYPTO_BUFFER_POOL *)");
}

Assistant:

void CRYPTO_BUFFER_POOL_free(CRYPTO_BUFFER_POOL *pool) {
  if (pool == NULL) {
    return;
  }

#if !defined(NDEBUG)
  CRYPTO_MUTEX_lock_write(&pool->lock);
  assert(lh_CRYPTO_BUFFER_num_items(pool->bufs) == 0);
  CRYPTO_MUTEX_unlock_write(&pool->lock);
#endif

  lh_CRYPTO_BUFFER_free(pool->bufs);
  CRYPTO_MUTEX_cleanup(&pool->lock);
  OPENSSL_free(pool);
}